

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_BigNum.cpp
# Opt level: O2

bool __thiscall axl::cry::BigNum::getDecString(BigNum *this,String *string)

{
  char *p;
  
  p = BN_bn2dec((BIGNUM *)
                (this->super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>)
                .m_h);
  if (p == (char *)0x0) {
    setLastCryptoError();
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=(string,p);
    CRYPTO_free(p);
  }
  return p != (char *)0x0;
}

Assistant:

bool
BigNum::getDecString(sl::String* string) {
	char* p = BN_bn2dec(m_h);
	if (!p)
		return failWithLastCryptoError();

	*string = p;
	OPENSSL_free(p);
	return true;
}